

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

string * __thiscall CLParam<double>::getFullParamName_abi_cxx11_(CLParam<double> *this)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *fullname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_b0 [8];
  CLParam<double> *in_stack_ffffffffffffff58;
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"-",&local_39);
  std::operator+(__lhs,in_RDI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if ('\n' < *(char *)(in_RSI + 0x28)) {
    getShortParamNameStr_abi_cxx11_(in_stack_ffffffffffffff58);
    std::operator+(__lhs,(char *)in_RDI);
    std::operator+(__lhs,in_RDI);
    std::__cxx11::string::operator=((string *)in_RDI,local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
  }
  return __lhs;
}

Assistant:

std::string getFullParamName()
    {
        std::string fullname = std::string("-")+parameter_name ;
        if (parameter_name_short > 10) {
            fullname = getShortParamNameStr()+", -"+fullname ;
        }
        return fullname ;
    }